

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshader.cpp
# Opt level: O3

QByteArray * __thiscall
QShader::serialized(QByteArray *__return_storage_ptr__,QShader *this,SerializedFormatVersion version
                   )

{
  QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
  *pQVar1;
  QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
  *pQVar2;
  QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
  *pQVar3;
  QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
  *pQVar4;
  char cVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  QShaderPrivate *pQVar9;
  _Base_ptr p_Var10;
  uint version_00;
  undefined8 *puVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  int iVar15;
  long in_FS_OFFSET;
  QShaderCode local_c8;
  QShaderCode local_98;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (serialized(QShader::SerializedFormatVersion)::sd == '\0') {
    serialized();
  }
  pQVar9 = &serialized::sd;
  if (this->d != (QShaderPrivate *)0x0) {
    pQVar9 = this->d;
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  iVar15 = 0;
  QBuffer::QBuffer((QBuffer *)&local_68,(QObject *)0x0);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,(QIODevice *)&local_68);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,0x11);
  cVar5 = QBuffer::open((QBuffer *)&local_68,2);
  if (cVar5 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    version_00 = 6;
    if (version != Qt_6_4) {
      version_00 = version == Qt_6_5 ^ 9;
    }
    QDataStream::operator<<((QDataStream *)&local_58,version_00);
    QDataStream::operator<<((QDataStream *)&local_58,pQVar9->stage);
    QShaderDescription::serialize(&pQVar9->desc,(QDataStream *)&local_58,version_00);
    pQVar1 = (pQVar9->shaders).d.d.ptr;
    if (pQVar1 != (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      iVar15 = (int)(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar15);
    pQVar1 = (pQVar9->shaders).d.d.ptr;
    if (pQVar1 == (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = *(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<QShaderKey,_QShaderCode,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShaderCode>_>_>_>
                   *)0x0) {
      p_Var10 = (_Base_ptr)0x0;
    }
    if (p_Var6 != p_Var10) {
      do {
        writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var6 + 1));
        local_c8.m_entryPoint.d.ptr = (char *)0x0;
        local_c8.m_entryPoint.d.size = 0;
        local_c8.m_shader.d.size = 0;
        local_c8.m_entryPoint.d.d = (Data *)0x0;
        local_c8.m_shader.d.d = (Data *)0x0;
        local_c8.m_shader.d.ptr = (char *)0x0;
        QMap<QShaderKey,_QShaderCode>::value
                  (&local_98,&pQVar9->shaders,(QShaderKey *)(p_Var6 + 1),&local_c8);
        if (&(local_c8.m_entryPoint.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_c8.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
              ._M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_entryPoint.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_c8.m_shader.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_shader.d.d)->super_QArrayData,1,0x10);
          }
        }
        local_c8.m_shader.d.d = local_98.m_shader.d.d;
        local_c8.m_shader.d.ptr = local_98.m_shader.d.ptr;
        local_c8.m_shader.d.size = local_98.m_shader.d.size;
        if (&(local_98.m_shader.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        ::operator<<((QDataStream *)&local_58,&local_c8.m_shader);
        if (&(local_c8.m_shader.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_shader.d.d)->super_QArrayData,1,0x10);
          }
        }
        local_c8.m_shader.d.d = local_98.m_entryPoint.d.d;
        local_c8.m_shader.d.ptr = local_98.m_entryPoint.d.ptr;
        local_c8.m_shader.d.size = local_98.m_entryPoint.d.size;
        if (&(local_98.m_entryPoint.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        ::operator<<((QDataStream *)&local_58,&local_c8.m_shader);
        if (&(local_c8.m_shader.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.m_shader.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_98.m_entryPoint.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.m_entryPoint.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
              ._M_i == 0) {
            QArrayData::deallocate(&(local_98.m_entryPoint.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_98.m_shader.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_98.m_shader.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_98.m_shader.d.d)->super_QArrayData,1,0x10);
          }
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var10);
    }
    pQVar2 = (pQVar9->bindings).d.d.ptr;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      iVar15 = 0;
    }
    else {
      iVar15 = (int)(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar15);
    pQVar2 = (pQVar9->bindings).d.d.ptr;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = *(_Base_ptr *)
                ((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar2 == (QMapData<std::map<QShaderKey,_QMap<int,_std::pair<int,_int>_>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QMap<int,_std::pair<int,_int>_>_>_>_>_>
                   *)0x0) {
      p_Var10 = (_Base_ptr)0x0;
    }
    if (p_Var6 != p_Var10) {
      do {
        writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var6 + 1));
        iVar15 = 0;
        if (p_Var6[1]._M_left != (_Base_ptr)0x0) {
          iVar15 = *(int *)&p_Var6[1]._M_left[1]._M_left;
        }
        QDataStream::operator<<((QDataStream *)&local_58,iVar15);
        p_Var12 = p_Var6[1]._M_left;
        if (p_Var12 == (_Base_ptr)0x0) {
          p_Var7 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var7 = *(_Rb_tree_node_base **)(p_Var12 + 1);
        }
        p_Var13 = (_Rb_tree_node_base *)&p_Var12->_M_left;
        if (p_Var12 == (_Base_ptr)0x0) {
          p_Var13 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var7 != p_Var13; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          QDataStream::operator<<((QDataStream *)&local_58,p_Var7[1]._M_color);
          QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var7[1].field_0x4);
          QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var7[1]._M_parent);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var10);
    }
    pQVar3 = (pQVar9->combinedImageMap).d.d.ptr;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      iVar15 = 0;
    }
    else {
      iVar15 = (int)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    QDataStream::operator<<((QDataStream *)&local_58,iVar15);
    pQVar3 = (pQVar9->combinedImageMap).d.d.ptr;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = *(_Base_ptr *)
                ((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var10 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar3 == (QMapData<std::map<QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QList<QShader::SeparateToCombinedImageSamplerMapping>_>_>_>_>
                   *)0x0) {
      p_Var10 = (_Base_ptr)0x0;
    }
    if (p_Var6 != p_Var10) {
      do {
        writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var6 + 1));
        QDataStream::operator<<((QDataStream *)&local_58,p_Var6[2]._M_color);
        if (*(long *)(p_Var6 + 2) != 0) {
          p_Var12 = p_Var6[1]._M_right;
          p_Var14 = p_Var12 + *(long *)(p_Var6 + 2);
          do {
            ::operator<<((QDataStream *)&local_58,(QByteArray *)p_Var12);
            QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var12->_M_right);
            QDataStream::operator<<((QDataStream *)&local_58,*(int *)((long)&p_Var12->_M_right + 4))
            ;
            p_Var12 = p_Var12 + 1;
          } while (p_Var12 != p_Var14);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var10);
    }
    if (version != Qt_6_4) {
      pQVar4 = (pQVar9->nativeShaderInfoMap).d.d.ptr;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        iVar15 = 0;
      }
      else {
        iVar15 = (int)(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      QDataStream::operator<<((QDataStream *)&local_58,iVar15);
      pQVar4 = (pQVar9->nativeShaderInfoMap).d.d.ptr;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        p_Var6 = (_Base_ptr)0x0;
      }
      else {
        p_Var6 = *(_Base_ptr *)
                  ((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      p_Var10 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar4 == (QMapData<std::map<QShaderKey,_QShader::NativeShaderInfo,_std::less<QShaderKey>,_std::allocator<std::pair<const_QShaderKey,_QShader::NativeShaderInfo>_>_>_>
                     *)0x0) {
        p_Var10 = (_Base_ptr)0x0;
      }
      if (p_Var6 != p_Var10) {
        do {
          writeShaderKey((QDataStream *)&local_58,(QShaderKey *)(p_Var6 + 1));
          QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var6[1]._M_left);
          iVar15 = 0;
          if (p_Var6[1]._M_right != (_Base_ptr)0x0) {
            iVar15 = *(int *)&p_Var6[1]._M_right[1]._M_left;
          }
          QDataStream::operator<<((QDataStream *)&local_58,iVar15);
          p_Var12 = p_Var6[1]._M_right;
          if (p_Var12 == (_Base_ptr)0x0) {
            p_Var7 = (_Rb_tree_node_base *)0x0;
          }
          else {
            p_Var7 = *(_Rb_tree_node_base **)(p_Var12 + 1);
          }
          p_Var13 = (_Rb_tree_node_base *)&p_Var12->_M_left;
          if (p_Var12 == (_Base_ptr)0x0) {
            p_Var13 = (_Rb_tree_node_base *)0x0;
          }
          for (; p_Var7 != p_Var13; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7))
          {
            QDataStream::operator<<((QDataStream *)&local_58,p_Var7[1]._M_color);
            QDataStream::operator<<((QDataStream *)&local_58,*(int *)&p_Var7[1].field_0x4);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != p_Var10);
      }
    }
    lVar8 = QBuffer::buffer();
    puVar11 = *(undefined8 **)(lVar8 + 8);
    if (puVar11 == (undefined8 *)0x0) {
      puVar11 = &QByteArray::_empty;
    }
    qCompress((uchar *)__return_storage_ptr__,(longlong)puVar11,(int)*(undefined8 *)(lVar8 + 0x10));
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QBuffer::~QBuffer((QBuffer *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QShader::serialized(SerializedFormatVersion version) const
{
    static QShaderPrivate sd;
    QShaderPrivate *dd = d ? d : &sd;

    QBuffer buf;
    QDataStream ds(&buf);
    ds.setVersion(QDataStream::Qt_5_10);
    if (!buf.open(QIODevice::WriteOnly))
        return QByteArray();

    const int qsbVersion = QShaderPrivate::qtQsbVersion(version);
    ds << qsbVersion;

    ds << int(dd->stage);
    dd->desc.serialize(&ds, qsbVersion);
    ds << int(dd->shaders.size());
    for (auto it = dd->shaders.cbegin(), itEnd = dd->shaders.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const QShaderCode &shader(dd->shaders.value(k));
        ds << shader.shader();
        ds << shader.entryPoint();
    }
    ds << int(dd->bindings.size());
    for (auto it = dd->bindings.cbegin(), itEnd = dd->bindings.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const NativeResourceBindingMap &map(it.value());
        ds << int(map.size());
        for (auto mapIt = map.cbegin(), mapItEnd = map.cend(); mapIt != mapItEnd; ++mapIt) {
            ds << mapIt.key();
            ds << mapIt.value().first;
            ds << mapIt.value().second;
        }
    }
    ds << int(dd->combinedImageMap.size());
    for (auto it = dd->combinedImageMap.cbegin(), itEnd = dd->combinedImageMap.cend(); it != itEnd; ++it) {
        const QShaderKey &k(it.key());
        writeShaderKey(&ds, k);
        const SeparateToCombinedImageSamplerMappingList &list(it.value());
        ds << int(list.size());
        for (auto listIt = list.cbegin(), listItEnd = list.cend(); listIt != listItEnd; ++listIt) {
            ds << listIt->combinedSamplerName;
            ds << listIt->textureBinding;
            ds << listIt->samplerBinding;
        }
    }
    if (qsbVersion > QShaderPrivate::QSB_VERSION_WITHOUT_NATIVE_SHADER_INFO) {
        ds << int(dd->nativeShaderInfoMap.size());
        for (auto it = dd->nativeShaderInfoMap.cbegin(), itEnd = dd->nativeShaderInfoMap.cend(); it != itEnd; ++it) {
            const QShaderKey &k(it.key());
            writeShaderKey(&ds, k);
            ds << it->flags;
            ds << int(it->extraBufferBindings.size());
            for (auto mapIt = it->extraBufferBindings.cbegin(), mapItEnd = it->extraBufferBindings.cend();
                 mapIt != mapItEnd; ++mapIt)
            {
                ds << mapIt.key();
                ds << mapIt.value();
            }
        }
    }

    return qCompress(buf.buffer());
}